

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPDirective::generateDOT
          (OpenMPDirective *this,ofstream *dot_file,int depth,int index,string *parent_node,
          string *trait_score)

{
  OpenMPClause *pOVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  reference ppcVar6;
  size_type sVar7;
  reference ppOVar8;
  string local_1238 [32];
  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
  local_1218;
  OpenMPClause **local_1210;
  uint local_1204;
  iterator iStack_1200;
  int clause_index;
  iterator iter;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *clauses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  char **local_1070;
  allocator<char> local_1061;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  string local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_e40;
  char **local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  string local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  undefined1 local_bf0 [8];
  string node_id;
  undefined1 local_bc8 [8];
  string tkind_2;
  string expr_name_2;
  string list_name_2;
  undefined1 local_b60 [4];
  int list_index_2;
  string combiner;
  string id;
  iterator list_item_2;
  vector<const_char_*,_std::allocator<const_char_*>_> *list_2;
  allocator<char> local_b01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_8e0;
  char **local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  string local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  allocator<char> local_7e9;
  undefined1 local_7e8 [8];
  string tkind_1;
  string expr_name_1;
  string list_name_1;
  iterator iStack_780;
  int list_index_1;
  iterator list_item_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *list_1;
  allocator<char> local_761;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_540;
  char **local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  allocator<char> local_449;
  undefined1 local_448 [8];
  string tkind;
  string expr_name;
  string list_name;
  iterator iStack_3e0;
  int list_index;
  iterator list_item;
  vector<const_char_*,_std::allocator<const_char_*>_> *list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string directive_id;
  undefined1 local_108 [8];
  string indent;
  string current_line;
  string local_a8;
  string local_88 [52];
  OpenMPDirectiveKind local_54;
  undefined1 local_50 [4];
  OpenMPDirectiveKind kind;
  string directive_kind;
  string *trait_score_local;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPDirective *this_local;
  
  directive_kind.field_2._8_8_ = trait_score;
  std::__cxx11::string::string((string *)local_50);
  local_54 = getKind(this);
  switch(local_54) {
  case OMPD_for_simd:
    std::__cxx11::string::operator=((string *)local_50,"for_simd");
    break;
  default:
    toString_abi_cxx11_(&local_a8,this);
    toString_abi_cxx11_((string *)((long)&current_line.field_2 + 8),this);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_88,(ulong)&local_a8);
    std::__cxx11::string::operator=((string *)local_50,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)(current_line.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_a8);
    break;
  case OMPD_distribute_simd:
    std::__cxx11::string::operator=((string *)local_50,"distribute_simd");
    break;
  case OMPD_distribute_parallel_for:
    std::__cxx11::string::operator=((string *)local_50,"distribute_parallel_for");
    break;
  case OMPD_distribute_parallel_do:
    std::__cxx11::string::operator=((string *)local_50,"distribute_parallel_do");
    break;
  case OMPD_distribute_parallel_for_simd:
    std::__cxx11::string::operator=((string *)local_50,"distribute_parallel_for_simd");
    break;
  case OMPD_distribute_parallel_do_simd:
    std::__cxx11::string::operator=((string *)local_50,"distribute_parallel_do_simd");
    break;
  case OMPD_cancellation_point:
    std::__cxx11::string::operator=((string *)local_50,"cancellation_point");
    break;
  case OMPD_declare_reduction:
    std::__cxx11::string::operator=((string *)local_50,"declare_reduction");
    break;
  case OMPD_declare_mapper:
    std::__cxx11::string::operator=((string *)local_50,"declare_mapper");
    break;
  case OMPD_taskloop_simd:
    std::__cxx11::string::operator=((string *)local_50,"taskloop_simd");
    break;
  case OMPD_target_data:
    std::__cxx11::string::operator=((string *)local_50,"target_data");
    break;
  case OMPD_target_enter_data:
    std::__cxx11::string::operator=((string *)local_50,"target_enter_data");
    break;
  case OMPD_target_update:
    std::__cxx11::string::operator=((string *)local_50,"target_update");
    break;
  case OMPD_target_exit_data:
    std::__cxx11::string::operator=((string *)local_50,"target_exit_data");
    break;
  case OMPD_declare_target:
    std::__cxx11::string::operator=((string *)local_50,"declare_target");
    break;
  case OMPD_end_declare_target:
    std::__cxx11::string::operator=((string *)local_50,"end_declare_target");
    break;
  case OMPD_depobj:
    std::__cxx11::string::operator=((string *)local_50,"depobj ");
    break;
  case OMPD_teams_distribute:
    std::__cxx11::string::operator+=((string *)local_50,"teams_distribute ");
    break;
  case OMPD_teams_distribute_simd:
    std::__cxx11::string::operator+=((string *)local_50,"teams_distribute_simd ");
    break;
  case OMPD_teams_distribute_parallel_for:
    std::__cxx11::string::operator+=((string *)local_50,"teams_distribute_parallel_for ");
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    std::__cxx11::string::operator+=((string *)local_50,"teams_distribute_parallel_for_simd ");
    break;
  case OMPD_teams_loop:
    std::__cxx11::string::operator+=((string *)local_50,"teams_loop ");
    break;
  case OMPD_target_parallel:
    std::__cxx11::string::operator+=((string *)local_50,"target_parallel ");
    break;
  case OMPD_target_parallel_for:
    std::__cxx11::string::operator+=((string *)local_50,"target_parallel_for ");
    break;
  case OMPD_target_parallel_for_simd:
    std::__cxx11::string::operator+=((string *)local_50,"target_parallel_for_simd ");
    break;
  case OMPD_target_parallel_loop:
    std::__cxx11::string::operator+=((string *)local_50,"target_parallel_loop ");
    break;
  case OMPD_target_simd:
    std::__cxx11::string::operator+=((string *)local_50,"target_simd ");
    break;
  case OMPD_target_teams:
    std::__cxx11::string::operator+=((string *)local_50,"target_teams ");
    break;
  case OMPD_target_teams_distribute:
    std::__cxx11::string::operator+=((string *)local_50,"target_teams_distribute ");
    break;
  case OMPD_target_teams_distribute_simd:
    std::__cxx11::string::operator+=((string *)local_50,"target_teams_distribute_simd ");
    break;
  case OMPD_target_teams_loop:
    std::__cxx11::string::operator+=((string *)local_50,"target_teams_loop ");
    break;
  case OMPD_target_teams_distribute_parallel_for:
    std::__cxx11::string::operator+=((string *)local_50,"target_teams_distribute_parallel_for ");
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    std::__cxx11::string::operator+=
              ((string *)local_50,"target_teams_distribute_parallel_for_simd ");
    break;
  case OMPD_teams_distribute_parallel_do:
    std::__cxx11::string::operator+=((string *)local_50,"teams distribute parallel do ");
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_50,"teams distribute parallel do simd ");
    break;
  case OMPD_target_parallel_do:
    std::__cxx11::string::operator+=((string *)local_50,"target parallel do ");
    break;
  case OMPD_target_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_50,"target parallel do simd ");
    break;
  case OMPD_target_teams_distribute_parallel_do:
    std::__cxx11::string::operator+=((string *)local_50,"target teams distribute parallel do ");
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
    std::__cxx11::string::operator+=((string *)local_50,"target teams distribute parallel do simd ")
    ;
  }
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,(long)depth,'\t',
             (allocator<char> *)(directive_id.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(directive_id.field_2._M_local_buf + 0xf));
  std::operator+(&local_190,parent_node,"_");
  std::operator+(&local_170,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_150,&local_170,"_");
  std::__cxx11::to_string(&local_1b0,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 &local_150,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 parent_node);
  std::operator+(&local_210,&local_230," -- ");
  std::operator+(&local_1f0,&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
  std::operator+(&local_1d0,&local_1f0,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar4);
  std::__cxx11::string::operator+=((string *)local_108,"\t");
  poVar5 = std::operator<<((ostream *)dot_file,(string *)local_108);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::operator+(&local_270," [label = \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_250,&local_270,"\"]\n");
  std::operator<<(poVar5,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  bVar3 = std::operator!=(trait_score,"");
  if (bVar3) {
    std::operator+(&local_310,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_2f0,&local_310," -- ");
    std::operator+(&local_2d0,&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_2b0,&local_2d0,"_score");
    std::operator+(&local_290,&local_2b0,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "\t");
    std::operator+(&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::operator+(&local_390,&local_3b0,"_score");
    std::operator+(&local_370,&local_390," [label = \"score\\n ");
    std::operator+(&local_350,&local_370,trait_score);
    std::operator+(&local_330,&local_350,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&list);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
  }
  if (local_54 == OMPD_allocate) {
    list_item._M_current =
         (char **)OpenMPAllocateDirective::getAllocateList((OpenMPAllocateDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffc20);
    list_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_448,"allocate",&local_449);
    std::allocator<char>::~allocator(&local_449);
    std::operator+(&local_490,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                   "_directive_list_");
    std::__cxx11::to_string(&local_4b0,0);
    std::operator+(&local_470,&local_490,&local_4b0);
    std::__cxx11::string::operator=
              ((string *)(expr_name.field_2._M_local_buf + 8),(string *)&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_490);
    std::operator+(&local_530,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448);
    std::operator+(&local_510,&local_530," -- ");
    std::operator+(&local_4f0,&local_510,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name.field_2 + 8));
    std::operator+(&local_4d0,&local_4f0,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    local_538 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (list_item._M_current);
    iStack_3e0 = (iterator)local_538;
    while( true ) {
      local_540._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              (list_item._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xfffffffffffffc20,&local_540);
      if (!bVar3) break;
      std::operator+(&local_580,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_5a0,list_name.field_2._12_4_);
      std::operator+(&local_560,&local_580,&local_5a0);
      std::__cxx11::string::operator=
                ((string *)(tkind.field_2._M_local_buf + 8),(string *)&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_580);
      list_name.field_2._12_4_ = list_name.field_2._12_4_ + 1;
      std::operator+(&local_640,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_620,&local_640,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name.field_2 + 8));
      std::operator+(&local_600,&local_620," -- ");
      std::operator+(&local_5e0,&local_600,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_5c0,&local_5e0,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      std::operator+(&local_740,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_720,&local_740,"\t");
      std::operator+(&local_700,&local_720,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_6e0,&local_700," [label = \"");
      std::operator+(&local_6c0,&local_6e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind.field_2 + 8));
      std::operator+(&local_6a0,&local_6c0,"\\n ");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffc20);
      pcVar4 = *ppcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,pcVar4,&local_761);
      std::operator+(&local_680,&local_6a0,&local_760);
      std::operator+(&local_660,&local_680,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_660);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_760);
      std::allocator<char>::~allocator(&local_761);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_740);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffc20,0);
    }
    std::__cxx11::string::~string((string *)local_448);
    std::__cxx11::string::~string((string *)(tkind.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name.field_2._M_local_buf + 8));
  }
  else if (local_54 == OMPD_threadprivate) {
    list_item_1._M_current =
         (char **)OpenMPThreadprivateDirective::getThreadprivateList
                            ((OpenMPThreadprivateDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffff880);
    list_name_1.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind_1.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7e8,"threadprivate",&local_7e9);
    std::allocator<char>::~allocator(&local_7e9);
    std::operator+(&local_830,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8,
                   "_directive_list_");
    std::__cxx11::to_string(&local_850,0);
    std::operator+(&local_810,&local_830,&local_850);
    std::__cxx11::string::operator=
              ((string *)(expr_name_1.field_2._M_local_buf + 8),(string *)&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&local_830);
    std::operator+(&local_8d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8);
    std::operator+(&local_8b0,&local_8d0," -- ");
    std::operator+(&local_890,&local_8b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name_1.field_2 + 8));
    std::operator+(&local_870,&local_890,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::~string((string *)&local_8d0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    local_8d8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (list_item_1._M_current);
    iStack_780 = (iterator)local_8d8;
    while( true ) {
      local_8e0._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              (list_item_1._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xfffffffffffff880,&local_8e0);
      if (!bVar3) break;
      std::operator+(&local_920,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_1.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_940,list_name_1.field_2._12_4_);
      std::operator+(&local_900,&local_920,&local_940);
      std::__cxx11::string::operator=
                ((string *)(tkind_1.field_2._M_local_buf + 8),(string *)&local_900);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_920);
      list_name_1.field_2._12_4_ = list_name_1.field_2._12_4_ + 1;
      std::operator+(&local_9e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_9c0,&local_9e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_1.field_2 + 8));
      std::operator+(&local_9a0,&local_9c0," -- ");
      std::operator+(&local_980,&local_9a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_960,&local_980,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_960);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::__cxx11::string::~string((string *)&local_9e0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      std::operator+(&local_ae0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_ac0,&local_ae0,"\t");
      std::operator+(&local_aa0,&local_ac0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_a80,&local_aa0," [label = \"");
      std::operator+(&local_a60,&local_a80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_1.field_2 + 8));
      std::operator+(&local_a40,&local_a60,"\\n ");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffff880);
      pcVar4 = *ppcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,pcVar4,&local_b01);
      std::operator+(&local_a20,&local_a40,&local_b00);
      std::operator+(&local_a00,&local_a20,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_a00);
      std::__cxx11::string::~string((string *)&local_a00);
      std::__cxx11::string::~string((string *)&local_a20);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator(&local_b01);
      std::__cxx11::string::~string((string *)&local_a40);
      std::__cxx11::string::~string((string *)&local_a60);
      std::__cxx11::string::~string((string *)&local_a80);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::__cxx11::string::~string((string *)&local_ac0);
      std::__cxx11::string::~string((string *)&local_ae0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffff880,0);
    }
    std::__cxx11::string::~string((string *)local_7e8);
    std::__cxx11::string::~string((string *)(tkind_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name_1.field_2._M_local_buf + 8));
  }
  else if (local_54 == OMPD_declare_reduction) {
    this_00 = OpenMPDeclareReductionDirective::getTypenameList
                        ((OpenMPDeclareReductionDirective *)this);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                       *)((long)&id.field_2 + 8));
    OpenMPDeclareReductionDirective::getIdentifier_abi_cxx11_
              ((string *)((long)&combiner.field_2 + 8),(OpenMPDeclareReductionDirective *)this);
    OpenMPDeclareReductionDirective::getCombiner_abi_cxx11_
              ((string *)local_b60,(OpenMPDeclareReductionDirective *)this);
    list_name_2.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)(expr_name_2.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(tkind_2.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_bc8,"declare_reduction",
               (allocator<char> *)(node_id.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(node_id.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8,
                   "_reduction_identifier");
    std::operator+(&local_c70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8);
    std::operator+(&local_c50,&local_c70," -- ");
    std::operator+(&local_c30,&local_c50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_c10,&local_c30,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_c10);
    std::__cxx11::string::~string((string *)&local_c10);
    std::__cxx11::string::~string((string *)&local_c30);
    std::__cxx11::string::~string((string *)&local_c50);
    std::__cxx11::string::~string((string *)&local_c70);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+(&local_d50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "\t");
    std::operator+(&local_d30,&local_d50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_d10,&local_d30," [label = \"");
    std::operator+(&local_cf0,&local_d10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_cd0,&local_cf0,"\\n ");
    std::operator+(&local_cb0,&local_cd0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&combiner.field_2 + 8));
    std::operator+(&local_c90,&local_cb0,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::__cxx11::string::~string((string *)&local_d10);
    std::__cxx11::string::~string((string *)&local_d30);
    std::__cxx11::string::~string((string *)&local_d50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+(&local_d90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8,
                   "_typename_list_");
    std::__cxx11::to_string(&local_db0,0);
    std::operator+(&local_d70,&local_d90,&local_db0);
    std::__cxx11::string::operator=
              ((string *)(expr_name_2.field_2._M_local_buf + 8),(string *)&local_d70);
    std::__cxx11::string::~string((string *)&local_d70);
    std::__cxx11::string::~string((string *)&local_db0);
    std::__cxx11::string::~string((string *)&local_d90);
    std::operator+(&local_e30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8);
    std::operator+(&local_e10,&local_e30," -- ");
    std::operator+(&local_df0,&local_e10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expr_name_2.field_2 + 8));
    std::operator+(&local_dd0,&local_df0,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_dd0);
    std::__cxx11::string::~string((string *)&local_dd0);
    std::__cxx11::string::~string((string *)&local_df0);
    std::__cxx11::string::~string((string *)&local_e10);
    std::__cxx11::string::~string((string *)&local_e30);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    local_e38 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(this_00);
    id.field_2._8_8_ = local_e38;
    while( true ) {
      local_e40._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(this_00);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                          *)((long)&id.field_2 + 8),&local_e40);
      if (!bVar3) break;
      std::operator+(&local_e80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_2.field_2 + 8),"_expr");
      std::__cxx11::to_string(&local_ea0,list_name_2.field_2._12_4_);
      std::operator+(&local_e60,&local_e80,&local_ea0);
      std::__cxx11::string::operator=
                ((string *)(tkind_2.field_2._M_local_buf + 8),(string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_ea0);
      std::__cxx11::string::~string((string *)&local_e80);
      list_name_2.field_2._12_4_ = list_name_2.field_2._12_4_ + 1;
      std::operator+(&local_f40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_f20,&local_f40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_name_2.field_2 + 8));
      std::operator+(&local_f00,&local_f20," -- ");
      std::operator+(&local_ee0,&local_f00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_ec0,&local_ee0,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_ec0);
      std::__cxx11::string::~string((string *)&local_ec0);
      std::__cxx11::string::~string((string *)&local_ee0);
      std::__cxx11::string::~string((string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_f20);
      std::__cxx11::string::~string((string *)&local_f40);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      std::operator+(&local_1040,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_1020,&local_1040,"\t");
      std::operator+(&local_1000,&local_1020,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_fe0,&local_1000," [label = \"");
      std::operator+(&local_fc0,&local_fe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tkind_2.field_2 + 8));
      std::operator+(&local_fa0,&local_fc0,"\\n ");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)((long)&id.field_2 + 8));
      pcVar4 = *ppcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1060,pcVar4,&local_1061);
      std::operator+(&local_f80,&local_fa0,&local_1060);
      std::operator+(&local_f60,&local_f80,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_f60);
      std::__cxx11::string::~string((string *)&local_f60);
      std::__cxx11::string::~string((string *)&local_f80);
      std::__cxx11::string::~string((string *)&local_1060);
      std::allocator<char>::~allocator(&local_1061);
      std::__cxx11::string::~string((string *)&local_fa0);
      std::__cxx11::string::~string((string *)&local_fc0);
      std::__cxx11::string::~string((string *)&local_fe0);
      std::__cxx11::string::~string((string *)&local_1000);
      std::__cxx11::string::~string((string *)&local_1020);
      std::__cxx11::string::~string((string *)&local_1040);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      local_1070 = (char **)__gnu_cxx::
                            __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                            ::operator++((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                          *)((long)&id.field_2 + 8),0);
    }
    std::operator+(&local_1090,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8,
                   "_combiner");
    std::__cxx11::string::operator=((string *)local_bf0,(string *)&local_1090);
    std::__cxx11::string::~string((string *)&local_1090);
    std::operator+(&local_1110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8);
    std::operator+(&local_10f0,&local_1110," -- ");
    std::operator+(&local_10d0,&local_10f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_10b0,&local_10d0,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_10b0);
    std::__cxx11::string::~string((string *)&local_10b0);
    std::__cxx11::string::~string((string *)&local_10d0);
    std::__cxx11::string::~string((string *)&local_10f0);
    std::__cxx11::string::~string((string *)&local_1110);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clauses,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "\t");
    std::operator+(&local_11d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clauses,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_11b0,&local_11d0," [label = \"");
    std::operator+(&local_1190,&local_11b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::operator+(&local_1170,&local_1190,"\\n ");
    std::operator+(&local_1150,&local_1170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60);
    std::operator+(&local_1130,&local_1150,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1130);
    std::__cxx11::string::~string((string *)&local_1130);
    std::__cxx11::string::~string((string *)&local_1150);
    std::__cxx11::string::~string((string *)&local_1170);
    std::__cxx11::string::~string((string *)&local_1190);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::__cxx11::string::~string((string *)&local_11d0);
    std::__cxx11::string::~string((string *)&clauses);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::__cxx11::string::~string((string *)local_bf0);
    std::__cxx11::string::~string((string *)local_bc8);
    std::__cxx11::string::~string((string *)(tkind_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(expr_name_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b60);
    std::__cxx11::string::~string((string *)(combiner.field_2._M_local_buf + 8));
  }
  iter._M_current = (OpenMPClause **)getClausesInOriginalOrder(this);
  sVar7 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)iter._M_current);
  if (sVar7 != 0) {
    __gnu_cxx::
    __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
    ::__normal_iterator(&stack0xffffffffffffee00);
    local_1204 = 0;
    local_1210 = (OpenMPClause **)
                 std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::begin
                           (iter._M_current);
    iStack_1200 = (iterator)local_1210;
    while( true ) {
      local_1218._M_current =
           (OpenMPClause **)
           std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::end(iter._M_current);
      bVar3 = __gnu_cxx::operator!=(&stack0xffffffffffffee00,&local_1218);
      if (!bVar3) break;
      ppOVar8 = __gnu_cxx::
                __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                ::operator*(&stack0xffffffffffffee00);
      uVar2 = local_1204;
      pOVar1 = *ppOVar8;
      std::__cxx11::string::string(local_1238,(string *)local_130);
      (*pOVar1->_vptr_OpenMPClause[1])(pOVar1,dot_file,(ulong)(depth + 1),(ulong)uVar2,local_1238);
      std::__cxx11::string::~string(local_1238);
      local_1204 = local_1204 + 1;
      __gnu_cxx::
      __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
      ::operator++(&stack0xffffffffffffee00,0);
    }
  }
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void OpenMPDirective::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node, std::string trait_score) {

    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
            directive_kind = "cancellation_point";
            break;
        case OMPD_for_simd:
            directive_kind = "for_simd";
            break;
        case OMPD_distribute_simd:
            directive_kind = "distribute_simd";
            break;
        case OMPD_distribute_parallel_for:
            directive_kind = "distribute_parallel_for";
            break; 
       case OMPD_distribute_parallel_do:
            directive_kind = "distribute_parallel_do";
            break;
        case OMPD_distribute_parallel_for_simd:
            directive_kind = "distribute_parallel_for_simd";
            break;
        case OMPD_distribute_parallel_do_simd:
            directive_kind = "distribute_parallel_do_simd";
            break;
        case OMPD_declare_reduction:
            directive_kind = "declare_reduction";
            break;
        case OMPD_declare_mapper:
            directive_kind = "declare_mapper";
            break;
        case OMPD_taskloop_simd:
            directive_kind = "taskloop_simd";
            break;
        case OMPD_target_data:
            directive_kind = "target_data";
            break;
        case OMPD_target_enter_data:
            directive_kind = "target_enter_data";
            break;
        case OMPD_target_exit_data:
            directive_kind = "target_exit_data";
            break;
        case OMPD_target_update:
            directive_kind = "target_update";
            break;
        case OMPD_declare_target:
            directive_kind = "declare_target";
            break;
        case OMPD_end_declare_target:
            directive_kind = "end_declare_target";
            break;
        case OMPD_depobj:
            directive_kind = "depobj ";
            break;
        case OMPD_teams_distribute:
            directive_kind += "teams_distribute ";
            break;
        case OMPD_teams_distribute_simd:
            directive_kind += "teams_distribute_simd ";
            break;
        case OMPD_teams_distribute_parallel_for:
            directive_kind += "teams_distribute_parallel_for ";
            break;
        case OMPD_teams_distribute_parallel_for_simd:
            directive_kind += "teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_loop:
            directive_kind += "teams_loop ";
            break;
        case OMPD_target_parallel:
            directive_kind += "target_parallel ";
            break;
        case OMPD_target_parallel_for:
            directive_kind += "target_parallel_for ";
            break;
        case OMPD_target_parallel_for_simd:
            directive_kind += "target_parallel_for_simd ";
            break;
        case OMPD_target_parallel_loop:
            directive_kind += "target_parallel_loop ";
            break;
        case OMPD_target_simd:
            directive_kind += "target_simd ";
            break;
        case OMPD_target_teams:
            directive_kind += "target_teams ";
            break;
        case OMPD_target_teams_distribute:
            directive_kind += "target_teams_distribute ";
            break;
        case OMPD_target_teams_distribute_simd:
            directive_kind += "target_teams_distribute_simd ";
            break;
        case OMPD_target_teams_loop:
            directive_kind += "target_teams_loop ";
            break;
        case OMPD_target_teams_distribute_parallel_for:
            directive_kind += "target_teams_distribute_parallel_for ";
            break;
        case OMPD_target_teams_distribute_parallel_for_simd:
            directive_kind += "target_teams_distribute_parallel_for_simd ";
            break;
        case OMPD_teams_distribute_parallel_do:
            directive_kind += "teams distribute parallel do ";
            break;
        case OMPD_teams_distribute_parallel_do_simd:
            directive_kind += "teams distribute parallel do simd ";
            break;
        case OMPD_target_parallel_do:
            directive_kind += "target parallel do ";
            break;
        case OMPD_target_parallel_do_simd:
            directive_kind += "target parallel do simd ";
            break;
        case OMPD_target_teams_distribute_parallel_do:
            directive_kind += "target teams distribute parallel do ";
            break;
        case OMPD_target_teams_distribute_parallel_do_simd:
            directive_kind += "target teams distribute parallel do simd ";
            break;
        default:
            directive_kind = this->toString().substr(0, this->toString().size()-1);
    }
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string directive_id = parent_node + "_" + directive_kind + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + directive_id + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    dot_file << indent << directive_id.c_str() << " [label = \"" + directive_kind + "\"]\n";

    // output score
    if (trait_score != "") {
        current_line = indent + directive_id + " -- " + directive_id + "_score" + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + directive_id + "_score" + " [label = \"score\\n " + trait_score + "\"]\n";
        dot_file << current_line.c_str();
    }; 

    switch (kind) {
        case OMPD_allocate: {
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_threadprivate: {
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            break;
        }
        case OMPD_declare_reduction: {
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            dot_file << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            dot_file << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                dot_file << current_line.c_str();
                current_line =
                        indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                        "\"]\n";
                dot_file << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            dot_file << current_line.c_str();
            break;
        }
        default: {
            ;
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(dot_file, depth+1, clause_index, directive_id);
            clause_index += 1;
        };
    };

}